

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O2

_vector3<double> * __thiscall
xray_re::_vector3<double>::rotate(_vector3<double> *this,_matrix<double> *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = (this->field_0).field_0.x;
  dVar2 = (this->field_0).field_0.y;
  dVar3 = (this->field_0).field_0.z;
  dVar4 = (m->field_0).field_0._11;
  dVar5 = (m->field_0).field_0._12;
  dVar6 = (m->field_0).field_0._21;
  dVar7 = (m->field_0).field_0._22;
  dVar8 = (m->field_0).field_0._31;
  dVar9 = (m->field_0).field_0._32;
  (this->field_0).field_0.z =
       (m->field_0).field_0._33 * dVar3 +
       (m->field_0).field_0._13 * dVar1 + (m->field_0).field_0._23 * dVar2;
  (this->field_0).field_0.x = dVar3 * dVar8 + dVar1 * dVar4 + dVar6 * dVar2;
  (this->field_0).field_0.y = dVar3 * dVar9 + dVar1 * dVar5 + dVar7 * dVar2;
  return this;
}

Assistant:

inline _vector3<T>& _vector3<T>::rotate(const _matrix<T>& m)
{
	T _x = m._11*x + m._21*y + m._31*z;
	T _y = m._12*x + m._22*y + m._32*z;
	z = m._13*x + m._23*y + m._33*z;
	x = _x;
	y = _y;
	return *this;
}